

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  size_t sVar1;
  char *__s;
  
  if (descriptor[0x24] == (Descriptor)0x0) {
    __s = "::google::protobuf::Message";
    if (*(int *)(*(long *)(*(long *)(this + 0x10) + 0xa0) + 0xa8) == 3) {
      __s = "::google::protobuf::MessageLite";
    }
  }
  else {
    __s = "::google::protobuf::MessageLite";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  return __return_storage_ptr__;
}

Assistant:

string SuperClassName(const Descriptor* descriptor, const Options& options) {
  return HasDescriptorMethods(descriptor->file(), options)
             ? "::google::protobuf::Message"
             : "::google::protobuf::MessageLite";
}